

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O3

unique_ptr<interfaces::Handler,_std::default_delete<interfaces::Handler>_> __thiscall
node::anon_unknown_2::NodeImpl::handleNotifyBlockTip(NodeImpl *this,NotifyBlockTipFn fn)

{
  function<void_(SynchronizationState,_const_CBlockIndex_*)> fn_00;
  function<void_(SynchronizationState,_interfaces::BlockTip,_double)> *in_RDX;
  long in_FS_OFFSET;
  connection cVar1;
  undefined8 in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  _Manager_type in_stack_ffffffffffffffa8;
  _Invoker_type in_stack_ffffffffffffffb0;
  undefined8 *local_48;
  undefined8 uStack_40;
  code *local_38;
  code *pcStack_30;
  CClientUIInterface local_20 [8];
  weak_count local_18;
  weak_count local_10;
  
  local_10.pi_ = *(sp_counted_base **)(in_FS_OFFSET + 0x28);
  std::function<void_(SynchronizationState,_interfaces::BlockTip,_double)>::function
            ((function<void_(SynchronizationState,_interfaces::BlockTip,_double)> *)
             &stack0xffffffffffffff98,in_RDX);
  local_38 = (code *)0x0;
  pcStack_30 = (code *)0x0;
  local_48 = (undefined8 *)0x0;
  uStack_40 = 0;
  local_48 = (undefined8 *)operator_new(0x20);
  *local_48 = 0;
  local_48[1] = 0;
  local_48[2] = 0;
  local_48[3] = in_stack_ffffffffffffffb0;
  if (in_stack_ffffffffffffffa8 != (_Manager_type)0x0) {
    *local_48 = in_stack_ffffffffffffff98;
    local_48[1] = in_stack_ffffffffffffffa0;
    local_48[2] = in_stack_ffffffffffffffa8;
    in_stack_ffffffffffffffa8 = (_Manager_type)0x0;
    in_stack_ffffffffffffffb0 = (_Invoker_type)0x0;
  }
  pcStack_30 = std::
               _Function_handler<void_(SynchronizationState,_const_CBlockIndex_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp:404:71)>
               ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(SynchronizationState,_const_CBlockIndex_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/node/interfaces.cpp:404:71)>
             ::_M_manager;
  fn_00.super__Function_base._M_functor._8_8_ = in_stack_ffffffffffffffa0;
  fn_00.super__Function_base._M_functor._M_unused._M_object = (void *)in_stack_ffffffffffffff98;
  fn_00.super__Function_base._M_manager = in_stack_ffffffffffffffa8;
  fn_00._M_invoker = (_Invoker_type)in_stack_ffffffffffffffb0;
  cVar1 = CClientUIInterface::NotifyBlockTip_connect(local_20,fn_00);
  cVar1._weak_connection_body.px = (element_type *)local_20;
  interfaces::MakeSignalHandler((interfaces *)this,cVar1);
  boost::detail::weak_count::~weak_count(&local_18);
  if (local_38 != (code *)0x0) {
    (*local_38)(&local_48,&local_48,3);
  }
  if (in_stack_ffffffffffffffa8 != (_Manager_type)0x0) {
    (*in_stack_ffffffffffffffa8)
              ((_Any_data *)&stack0xffffffffffffff98,(_Any_data *)&stack0xffffffffffffff98,
               __destroy_functor);
  }
  if (*(sp_counted_base **)(in_FS_OFFSET + 0x28) == local_10.pi_) {
    return (__uniq_ptr_data<interfaces::Handler,_std::default_delete<interfaces::Handler>,_true,_true>
            )(__uniq_ptr_data<interfaces::Handler,_std::default_delete<interfaces::Handler>,_true,_true>
              )this;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<Handler> handleNotifyBlockTip(NotifyBlockTipFn fn) override
    {
        return MakeSignalHandler(::uiInterface.NotifyBlockTip_connect([fn](SynchronizationState sync_state, const CBlockIndex* block) {
            fn(sync_state, BlockTip{block->nHeight, block->GetBlockTime(), block->GetBlockHash()},
                GuessVerificationProgress(Params().TxData(), block));
        }));
    }